

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O1

Value * soul::Value::fromExternalValue(soul::Type_const&,choc::value::ValueView_const&,soul::
        ConstantTable&,soul::StringDictionary&)::ConversionState::castOrThrow(soul::Type_const&,soul
        ::Value___(Value *__return_storage_ptr__,Type *type,Value *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Category CVar2;
  bool bVar3;
  BoundedIntSize BVar4;
  bool bVar5;
  CompileMessage errorMessage;
  CompileMessage local_90;
  CompileMessage local_58;
  
  bVar5 = Type::isEqual(&v->type,type,0);
  if (bVar5) {
    CVar2 = (v->type).arrayElementCategory;
    bVar5 = (v->type).isRef;
    bVar3 = (v->type).isConstant;
    (__return_storage_ptr__->type).category = (v->type).category;
    (__return_storage_ptr__->type).arrayElementCategory = CVar2;
    (__return_storage_ptr__->type).isRef = bVar5;
    (__return_storage_ptr__->type).isConstant = bVar3;
    (__return_storage_ptr__->type).primitiveType.type = (v->type).primitiveType.type;
    BVar4 = (v->type).arrayElementBoundingSize;
    (__return_storage_ptr__->type).boundingSize = (v->type).boundingSize;
    (__return_storage_ptr__->type).arrayElementBoundingSize = BVar4;
    (__return_storage_ptr__->type).structure.object = (v->type).structure.object;
    (v->type).structure.object = (Structure *)0x0;
    (__return_storage_ptr__->allocatedData).allocatedSize = (v->allocatedData).allocatedSize;
    ArrayWithPreallocation<unsigned_char,_8UL>::ArrayWithPreallocation
              (&(__return_storage_ptr__->allocatedData).allocatedData,
               &(v->allocatedData).allocatedData);
  }
  else {
    paVar1 = &local_90.description.field_2;
    local_90.description._M_string_length = 0;
    local_90.description.field_2._M_local_buf[0] = '\0';
    local_90.location.sourceCode.object = (SourceCodeText *)0x0;
    local_90.location.location.data = (char *)0x0;
    local_90.type = error;
    local_90.category = none;
    local_90.description._M_dataplus._M_p = (pointer)paVar1;
    tryCastToType(__return_storage_ptr__,v,type,&local_90);
    if ((__return_storage_ptr__->type).category == invalid) {
      CompileMessage::CompileMessage(&local_58,&local_90);
      throwError(&local_58);
    }
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_90.location.sourceCode.object);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.description._M_dataplus._M_p != paVar1) {
      operator_delete(local_90.description._M_dataplus._M_p,
                      CONCAT71(local_90.description.field_2._M_allocated_capacity._1_7_,
                               local_90.description.field_2._M_local_buf[0]) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static Value castOrThrow (const Type& type, Value&& v)
        {
            if (v.getType().isIdentical (type))
                return std::move (v);

            CompileMessage errorMessage;
            auto result = v.tryCastToType (type, errorMessage);

            if (! result.isValid())
                throwError (errorMessage);

            return result;
        }